

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

string * cmGlobalNinjaGenerator::EncodeIdent
                   (string *__return_storage_ptr__,string *ident,ostream *vars)

{
  pointer pcVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  ostream *poVar3;
  ostringstream names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1b8;
  ostringstream local_198 [376];
  
  pcVar1 = (ident->_M_dataplus)._M_p;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<std::unary_negate<std::pointer_to_unary_function<char,bool>>>>
                    (pcVar1,pcVar1 + ident->_M_string_length,IsIdentChar);
  if (_Var2._M_current == (ident->_M_dataplus)._M_p + ident->_M_string_length) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)ident);
    cmsys::SystemTools::ReplaceString(__return_storage_ptr__," ","$ ");
    cmsys::SystemTools::ReplaceString(__return_storage_ptr__,":","$:");
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar3 = std::operator<<((ostream *)local_198,"ident");
    EncodeIdent::VarNum = EncodeIdent::VarNum + 1;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__cxx11::stringbuf::str();
    poVar3 = std::operator<<(vars,(string *)&bStack_1b8);
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = std::operator<<(poVar3,(string *)ident);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&bStack_1b8);
    std::__cxx11::stringbuf::str();
    std::operator+(__return_storage_ptr__,"$",&bStack_1b8);
    std::__cxx11::string::~string((string *)&bStack_1b8);
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::EncodeIdent(const std::string& ident,
                                                std::ostream& vars)
{
  if (std::find_if(ident.begin(), ident.end(),
                   std::not1(std::ptr_fun(IsIdentChar))) != ident.end()) {
    static unsigned VarNum = 0;
    std::ostringstream names;
    names << "ident" << VarNum++;
    vars << names.str() << " = " << ident << "\n";
    return "$" + names.str();
  }
  std::string result = ident;
  cmSystemTools::ReplaceString(result, " ", "$ ");
  cmSystemTools::ReplaceString(result, ":", "$:");
  return result;
}